

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

bool __thiscall AST::equals(AST *this,AST *t)

{
  __type _Var1;
  int iVar2;
  int iVar3;
  long in_RSI;
  bool local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  AST *in_stack_ffffffffffffffa8;
  string local_38 [55];
  bool local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    getText_abi_cxx11_(in_stack_ffffffffffffffa8);
    getText_abi_cxx11_(in_stack_ffffffffffffffa8);
    _Var1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_71 = false;
    if (_Var1) {
      iVar2 = getType((AST *)0x28c268);
      iVar3 = getType((AST *)0x28c278);
      local_71 = iVar2 == iVar3;
    }
    local_1 = local_71;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    std::__cxx11::string::~string(local_38);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool AST::equals(const AST* t) const
{
	if (!t)
		return false;
	return (getText() == t->getText()) && (getType() == t->getType());
}